

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# highbd_fwd_txfm_sse4.c
# Opt level: O0

void av1_fwd_txfm2d_32x8_sse4_1(int16_t *input,int32_t *coeff,int stride,TX_TYPE tx_type,int bd)

{
  fwd_transform_1d_sse4_1 p_Var1;
  int iVar2;
  int iVar3;
  int iVar4;
  byte in_CL;
  __m128i *in_RSI;
  int i_1;
  int i;
  int num_col;
  int txfm_size_row;
  int txfm_size_col;
  int bitrow;
  int bitcol;
  fwd_transform_1d_sse4_1 row_txfm;
  fwd_transform_1d_sse4_1 col_txfm;
  int txh_idx;
  int txw_idx;
  int8_t *shift;
  __m128i *outcoef128;
  __m128i in [64];
  int in_stack_fffffffffffffb8c;
  undefined4 in_stack_fffffffffffffb90;
  undefined4 in_stack_fffffffffffffb94;
  int in_stack_fffffffffffffb98;
  fwd_transform_1d_sse4_1 input_00;
  longlong local_428 [130];
  byte local_15;
  
  local_15 = in_CL;
  iVar2 = get_txw_idx('\x10');
  iVar3 = get_txh_idx('\x10');
  p_Var1 = row_highbd_txfm32x8_arr[local_15];
  input_00 = col_highbd_txfm8x32_arr[local_15];
  iVar4 = (int)av1_fwd_cos_bit_col[iVar2][iVar3];
  iVar2 = (int)av1_fwd_cos_bit_row[iVar2][iVar3];
  load_buffer_32x8n((int16_t *)input_00,(__m128i *)CONCAT44(iVar4,iVar2),0x20,8,2,
                    in_stack_fffffffffffffb98,iVar3);
  for (iVar3 = 0; iVar3 < 8; iVar3 = iVar3 + 2) {
    (*p_Var1)((__m128i *)(local_428 + (long)iVar3 * 2),(__m128i *)(local_428 + (long)iVar3 * 2),
              iVar4,8);
  }
  col_txfm_16x16_rounding
            ((__m128i *)CONCAT44(in_stack_fffffffffffffb94,in_stack_fffffffffffffb90),
             in_stack_fffffffffffffb8c);
  transpose_8nx8n((__m128i *)local_428,in_RSI,0x20,8);
  for (iVar3 = 0; iVar3 < 2; iVar3 = iVar3 + 1) {
    (*input_00)(in_RSI + iVar3,in_RSI + iVar3,iVar2,2);
  }
  return;
}

Assistant:

void av1_fwd_txfm2d_32x8_sse4_1(const int16_t *input, int32_t *coeff,
                                int stride, TX_TYPE tx_type, int bd) {
  __m128i in[64];
  __m128i *outcoef128 = (__m128i *)coeff;
  const int8_t *shift = av1_fwd_txfm_shift_ls[TX_32X8];
  const int txw_idx = get_txw_idx(TX_32X8);
  const int txh_idx = get_txh_idx(TX_32X8);
  const fwd_transform_1d_sse4_1 col_txfm = row_highbd_txfm32x8_arr[tx_type];
  const fwd_transform_1d_sse4_1 row_txfm = col_highbd_txfm8x32_arr[tx_type];
  int bitcol = av1_fwd_cos_bit_col[txw_idx][txh_idx];
  int bitrow = av1_fwd_cos_bit_row[txw_idx][txh_idx];

  const int txfm_size_col = tx_size_wide[TX_32X8];
  const int txfm_size_row = tx_size_high[TX_32X8];
  const int num_col = txfm_size_row >> 2;

  // column transform
  load_buffer_32x8n(input, in, stride, 0, 0, shift[0], 8);
  for (int i = 0; i < txfm_size_row; i += 2) {
    col_txfm((in + i), (in + i), bitcol, txfm_size_row);
  }

  col_txfm_16x16_rounding(&in[0], -shift[1]);
  transpose_8nx8n(in, outcoef128, txfm_size_col, txfm_size_row);

  // row transform
  for (int i = 0; i < num_col; i++) {
    row_txfm((outcoef128 + i), (outcoef128 + i), bitrow, num_col);
  }
  (void)bd;
}